

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testUserEncodingPush(void)

{
  long lVar1;
  int iVar2;
  xmlCharEncodingHandlerPtr handler_00;
  long lVar3;
  int local_78;
  int local_74;
  int ret;
  int utf16Size;
  char *utf16;
  char buf [60];
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  xmlCharEncodingHandlerPtr handler;
  
  memcpy(&utf16,&DAT_00105740,0x3c);
  local_78 = 1;
  handler_00 = (xmlCharEncodingHandlerPtr)xmlGetCharEncodingHandler(2);
  _ret = convert(handler_00,(char *)&utf16,0x3b,&local_74);
  lVar3 = xmlCreatePushParserCtxt(0,0,0,0);
  xmlSwitchEncoding(lVar3,2);
  xmlParseChunk(lVar3,_ret,local_74,0);
  xmlParseChunk(lVar3,0,0,1);
  lVar1 = *(long *)(lVar3 + 0x10);
  if (((lVar1 != 0) && (*(long *)(lVar1 + 0x18) != 0)) &&
     (*(long *)(*(long *)(lVar1 + 0x18) + 0x18) != 0)) {
    iVar2 = xmlStrcmp(*(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x18) + 0x18) + 0x50),"text");
    if (iVar2 == 0) {
      local_78 = 0;
    }
  }
  xmlFreeDoc(lVar1);
  xmlFreeParserCtxt(lVar3);
  (*_xmlFree)(_ret);
  return local_78;
}

Assistant:

static int
testUserEncodingPush(void) {
    xmlCharEncodingHandlerPtr handler;
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    char buf[] =
        "\xEF\xBB\xBF"
        "<?xml version='1.0' encoding='ISO-8859-1'?>\n"
        "<d>text</d>\n";
    char *utf16;
    int utf16Size;
    int ret = 1;

    handler = xmlGetCharEncodingHandler(XML_CHAR_ENCODING_UTF16LE);
    utf16 = convert(handler, buf, sizeof(buf) - 1, &utf16Size);
    ctxt = xmlCreatePushParserCtxt(NULL, NULL, NULL, 0, NULL);
    xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_UTF16LE);
    xmlParseChunk(ctxt, utf16, utf16Size, 0);
    xmlParseChunk(ctxt, NULL, 0, 1);
    doc = ctxt->myDoc;

    if ((doc != NULL) &&
        (doc->children != NULL) &&
        (doc->children->children != NULL) &&
        (xmlStrcmp(doc->children->children->content, BAD_CAST "text") == 0))
        ret = 0;

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);
    xmlFree(utf16);

    return(ret);
}